

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matcher.cpp
# Opt level: O2

bool Kernel::MatchingUtils::haveReversedVariantArgs(Term *l1,Term *l2)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  DisagreementSetIterator *pDVar5;
  undefined4 extraout_var;
  TermList t1;
  TermList t2;
  CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>_>_>
  *i;
  IterTraits<Lib::CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>_>_>_>
  *i_00;
  CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>_>_>_>_>_>
  *i_01;
  ulong extraout_RDX;
  bool bVar6;
  VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_> local_120;
  VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_> dsit;
  VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_> local_110;
  VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_> local_108;
  uint right;
  undefined4 uStack_fc;
  uint left;
  undefined4 uStack_e4;
  VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_> local_c0;
  CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>_>_>
  local_b8;
  IterTraits<Lib::CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>_>_>_>
  it1;
  CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>_>_>
  local_88;
  CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>_>_>
  local_70;
  CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>_>_>_>_>_>
  local_58;
  
  if ((haveReversedVariantArgs(Kernel::Term*,Kernel::Term*)::leftToRight == '\0') &&
     (iVar2 = __cxa_guard_acquire(&haveReversedVariantArgs(Kernel::Term*,Kernel::Term*)::leftToRight
                                 ), iVar2 != 0)) {
    haveReversedVariantArgs::leftToRight._timestamp = 1;
    haveReversedVariantArgs::leftToRight._size = 0;
    haveReversedVariantArgs::leftToRight._deleted = 0;
    haveReversedVariantArgs::leftToRight._capacityIndex = 0;
    haveReversedVariantArgs::leftToRight._capacity = 0;
    haveReversedVariantArgs::leftToRight._20_8_ = 0;
    haveReversedVariantArgs::leftToRight._28_8_ = 0;
    haveReversedVariantArgs::leftToRight._afterLast._4_4_ = 0;
    __cxa_atexit(Lib::DHMap<unsigned_int,_unsigned_int,_Lib::IdentityHash,_Lib::DefaultHash>::~DHMap
                 ,&haveReversedVariantArgs::leftToRight,&__dso_handle);
    __cxa_guard_release(&haveReversedVariantArgs(Kernel::Term*,Kernel::Term*)::leftToRight);
  }
  if ((haveReversedVariantArgs(Kernel::Term*,Kernel::Term*)::rightToLeft == '\0') &&
     (iVar2 = __cxa_guard_acquire(&haveReversedVariantArgs(Kernel::Term*,Kernel::Term*)::rightToLeft
                                 ), iVar2 != 0)) {
    haveReversedVariantArgs::rightToLeft._timestamp = 1;
    haveReversedVariantArgs::rightToLeft._size = 0;
    haveReversedVariantArgs::rightToLeft._deleted = 0;
    haveReversedVariantArgs::rightToLeft._capacityIndex = 0;
    haveReversedVariantArgs::rightToLeft._capacity = 0;
    haveReversedVariantArgs::rightToLeft._20_8_ = 0;
    haveReversedVariantArgs::rightToLeft._28_8_ = 0;
    haveReversedVariantArgs::rightToLeft._afterLast._4_4_ = 0;
    __cxa_atexit(Lib::DHMap<unsigned_int,_unsigned_int,_Lib::IdentityHash,_Lib::DefaultHash>::~DHMap
                 ,&haveReversedVariantArgs::rightToLeft,&__dso_handle);
    __cxa_guard_release(&haveReversedVariantArgs(Kernel::Term*,Kernel::Term*)::rightToLeft);
  }
  Lib::DHMap<unsigned_int,_unsigned_int,_Lib::IdentityHash,_Lib::DefaultHash>::reset
            (&haveReversedVariantArgs::leftToRight);
  Lib::DHMap<unsigned_int,_unsigned_int,_Lib::IdentityHash,_Lib::DefaultHash>::reset
            (&haveReversedVariantArgs::rightToLeft);
  t2._content = 2;
  if (((l1->_args[0]._content & 0x10) == 0) || (-1 < *(int *)&l1->field_0xc)) {
    bVar6 = false;
    t1._content = t2._content;
  }
  else {
    if (((l2->_args[0]._content & 0x10) == 0) || (-1 < *(int *)&l2->field_0xc)) {
      return false;
    }
    t1 = SortHelper::getEqualityArgumentSort((Literal *)l1);
    t2 = SortHelper::getEqualityArgumentSort((Literal *)l2);
    bVar6 = true;
  }
  pDVar5 = (DisagreementSetIterator *)::operator_new(0x48);
  DisagreementSetIterator::DisagreementSetIterator
            (pDVar5,(TermList)l1->_args[*(uint *)&l1->field_0xc & 0xfffffff]._content,
             (TermList)l2->_args[(ulong)(*(uint *)&l2->field_0xc & 0xfffffff) - 1]._content,true);
  piVar1 = &(pDVar5->super_IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_>)._refCnt;
  *piVar1 = *piVar1 + 1;
  local_108._core = (IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_> *)pDVar5;
  pDVar5 = (DisagreementSetIterator *)::operator_new(0x48);
  DisagreementSetIterator::DisagreementSetIterator
            (pDVar5,(TermList)l1->_args[(ulong)(*(uint *)&l1->field_0xc & 0xfffffff) - 1]._content,
             (TermList)l2->_args[*(uint *)&l2->field_0xc & 0xfffffff]._content,true);
  iVar2 = (pDVar5->super_IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_>)._refCnt + 1;
  (pDVar5->super_IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_>)._refCnt = iVar2;
  _right = local_108._core;
  if ((DisagreementSetIterator *)local_108._core != (DisagreementSetIterator *)0x0) {
    (local_108._core)->_refCnt = (local_108._core)->_refCnt + 1;
    iVar2 = (pDVar5->super_IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_>)._refCnt;
  }
  (pDVar5->super_IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_>)._refCnt = iVar2 + 2;
  local_120._core = (IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_> *)pDVar5;
  _left = (IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_> *)pDVar5;
  local_c0._core = (IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_> *)pDVar5;
  Lib::iterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,Kernel::TermList>>>
            ((Lib *)&local_b8,
             (VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_> *)&left);
  Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>::~VirtualIterator
            ((VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_> *)&left);
  Lib::
  CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>_>_>
  ::CatIterator((CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>_>_>
                 *)&left,(VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_> *)&right,
                (IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>_> *
                )&local_b8);
  Lib::
  iterTraits<Lib::CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,Kernel::TermList>>,Lib::IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,Kernel::TermList>>>>>
            (&it1,(Lib *)&left,i);
  Lib::
  CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>_>_>
  ::~CatIterator((CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>_>_>
                  *)&left);
  Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>::~VirtualIterator
            ((VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_> *)&local_b8);
  Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>::~VirtualIterator(&local_120)
  ;
  Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>::~VirtualIterator
            ((VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_> *)&right);
  Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>::~VirtualIterator(&local_c0);
  Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>::~VirtualIterator(&local_108)
  ;
  if (bVar6) {
    pDVar5 = (DisagreementSetIterator *)::operator_new(0x48);
    DisagreementSetIterator::DisagreementSetIterator(pDVar5,t1,t2,true);
    piVar1 = &(pDVar5->super_IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_>)._refCnt;
    *piVar1 = *piVar1 + 1;
    local_110._core = (IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_> *)pDVar5;
    Lib::
    CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>_>_>
    ::CatIterator(&local_70,&it1._iter);
    local_120._core = local_110._core;
    if ((DisagreementSetIterator *)local_110._core != (DisagreementSetIterator *)0x0) {
      (local_110._core)->_refCnt = (local_110._core)->_refCnt + 1;
    }
    Lib::
    CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>_>_>
    ::CatIterator(&local_b8,&local_70);
    Lib::
    CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>_>_>
    ::CatIterator((CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>_>_>
                   *)&left,&local_b8);
    Lib::
    iterTraits<Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,Kernel::TermList>>,Lib::IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,Kernel::TermList>>>>>>
              ((IterTraits<Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>_>_>_>_>
                *)&right,(Lib *)&left,i_00);
    Lib::
    CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>_>_>
    ::~CatIterator((CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>_>_>
                    *)&left);
    Lib::
    CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>_>_>_>_>_>
    ::CatIterator((CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>_>_>_>_>_>
                   *)&left,&local_120,
                  (IterTraits<Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>_>_>_>_>
                   *)&right);
    Lib::
    iterTraits<Lib::CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,Kernel::TermList>>,Lib::IterTraits<Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,Kernel::TermList>>,Lib::IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,Kernel::TermList>>>>>>>>
              ((IterTraits<Lib::CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>_>_>_>_>_>_>
                *)&local_58,(Lib *)&left,i_01);
    Lib::
    CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>_>_>_>_>_>
    ::~CatIterator((CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>_>_>_>_>_>
                    *)&left);
    Lib::
    CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>_>_>
    ::~CatIterator((CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>_>_>
                    *)&right);
    Lib::
    CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>_>_>
    ::~CatIterator(&local_b8);
    Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>::~VirtualIterator
              (&local_120);
    Lib::
    pvi<Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,Kernel::TermList>>,Lib::IterTraits<Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,Kernel::TermList>>,Lib::IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,Kernel::TermList>>>>>>>>>
              ((Lib *)&dsit,
               (IterTraits<Lib::CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>_>_>_>_>_>_>
                *)&local_58);
    Lib::
    CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>_>_>_>_>_>
    ::~CatIterator(&local_58);
    Lib::
    CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>_>_>
    ::~CatIterator(&local_70);
    Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>::~VirtualIterator
              (&local_110);
  }
  else {
    Lib::
    CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>_>_>
    ::CatIterator(&local_88,&it1._iter);
    Lib::
    pvi<Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,Kernel::TermList>>,Lib::IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,Kernel::TermList>>>>>>
              ((Lib *)&dsit,
               (IterTraits<Lib::CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>_>_>_>
                *)&local_88);
    Lib::
    CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>_>_>
    ::~CatIterator(&local_88);
  }
  do {
    iVar2 = (*(dsit._core)->_vptr_IteratorCore[2])();
    if ((char)iVar2 == '\0') {
      bVar6 = haveReversedVariantArgs::leftToRight._size ==
              haveReversedVariantArgs::rightToLeft._size;
      goto LAB_00449d4b;
    }
    uVar3 = (*(dsit._core)->_vptr_IteratorCore[3])();
    bVar6 = false;
    if (((uVar3 & 1) == 0) || (bVar6 = false, (extraout_RDX & 1) == 0)) goto LAB_00449d4b;
    uVar3 = (uint)(CONCAT44(extraout_var,uVar3) >> 2);
    left = uVar3;
    uVar4 = (uint)(extraout_RDX >> 2);
    right = uVar4;
    uVar3 = Lib::DHMap<unsigned_int,_unsigned_int,_Lib::IdentityHash,_Lib::DefaultHash>::
            findOrInsert(&haveReversedVariantArgs::leftToRight,uVar3,&right);
    if (uVar3 != uVar4) break;
    uVar3 = left;
    uVar4 = Lib::DHMap<unsigned_int,_unsigned_int,_Lib::IdentityHash,_Lib::DefaultHash>::
            findOrInsert(&haveReversedVariantArgs::rightToLeft,right,&left);
  } while (uVar3 == uVar4);
  bVar6 = false;
LAB_00449d4b:
  Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>::~VirtualIterator(&dsit);
  Lib::
  CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>_>_>
  ::~CatIterator(&it1._iter);
  return bVar6;
}

Assistant:

bool MatchingUtils::haveReversedVariantArgs(Term* l1, Term* l2)
{
  ASS_EQ(l1->arity(), 2);
  ASS_EQ(l2->arity(), 2);

  static DHMap<unsigned,unsigned,IdentityHash,DefaultHash> leftToRight;
  static DHMap<unsigned,unsigned,IdentityHash,DefaultHash> rightToLeft;
  leftToRight.reset();
  rightToLeft.reset();

  TermList s1, s2;
  bool sortUsed = false;
  if(l1->isLiteral() && static_cast<Literal*>(l1)->isTwoVarEquality())
  {
    if(l2->isLiteral() && static_cast<Literal*>(l2)->isTwoVarEquality()){
       s1 = SortHelper::getEqualityArgumentSort(static_cast<Literal*>(l1));
       s2 = SortHelper::getEqualityArgumentSort(static_cast<Literal*>(l2));
       sortUsed = true;
    } else {
      return false;
    }
  }

  auto it1 = concatIters(
      vi( new DisagreementSetIterator(*l1->nthArgument(0),*l2->nthArgument(1)) ),
      vi( new DisagreementSetIterator(*l1->nthArgument(1),*l2->nthArgument(0)) ));

  VirtualIterator<pair<TermList, TermList> > dsit =
  sortUsed ? pvi(concatIters(vi(new DisagreementSetIterator(s1,s2)), it1)) :
             pvi(it1);

  while(dsit.hasNext()) {
    pair<TermList,TermList> dp=dsit.next(); //disagreement pair
    if(!dp.first.isVar() || !dp.second.isVar()) {
  return false;
    }
    unsigned left=dp.first.var();
    unsigned right=dp.second.var();
    if(right!=leftToRight.findOrInsert(left,right)) {
  return false;
    }
    if(left!=rightToLeft.findOrInsert(right,left)) {
  return false;
    }
  }
  if(leftToRight.size()!=rightToLeft.size()) {
    return false;
  }

  return true;
}